

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void delay_set_areg(DisasContext_conflict2 *s,uint regno,TCGv_i32 val,_Bool give_temp)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 tmp;
  TCGContext_conflict2 *tcg_ctx;
  _Bool give_temp_local;
  TCGv_i32 val_local;
  uint regno_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((s->writeback_mask & 1 << ((byte)regno & 0x1f)) == 0) {
    s->writeback_mask = 1 << ((byte)regno & 0x1f) | s->writeback_mask;
    if (give_temp) {
      s->writeback[regno] = val;
    }
    else {
      ret = tcg_temp_new_i32(tcg_ctx_00);
      s->writeback[regno] = ret;
      tcg_gen_mov_i32(tcg_ctx_00,ret,val);
    }
  }
  else if (give_temp) {
    tcg_temp_free_i32(tcg_ctx_00,s->writeback[regno]);
    s->writeback[regno] = val;
  }
  else {
    tcg_gen_mov_i32(tcg_ctx_00,s->writeback[regno],val);
  }
  return;
}

Assistant:

static void delay_set_areg(DisasContext *s, unsigned regno,
                           TCGv val, bool give_temp)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    if (s->writeback_mask & (1 << regno)) {
        if (give_temp) {
            tcg_temp_free(tcg_ctx, s->writeback[regno]);
            s->writeback[regno] = val;
        } else {
            tcg_gen_mov_i32(tcg_ctx, s->writeback[regno], val);
        }
    } else {
        s->writeback_mask |= 1 << regno;
        if (give_temp) {
            s->writeback[regno] = val;
        } else {
            TCGv tmp = tcg_temp_new(tcg_ctx);
            s->writeback[regno] = tmp;
            tcg_gen_mov_i32(tcg_ctx, tmp, val);
        }
    }
}